

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
* boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::new_(allocator_type al,size_t n)

{
  size_t size_index_;
  allocator_type al_00;
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  *in_RSI;
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  *in_RDI;
  size_t groups_size;
  size_t groups_size_index;
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  *n_00;
  
  n_00 = in_RDI;
  size_index_ = foa::
                size_index_for<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::pow2_size_policy>
                          (0xba3bd1);
  al_00.storage = (Storage *)pow2_size_policy::size(size_index_);
  table_arrays(in_RDI,size_index_,(size_t)&al_00.storage[-1].field_0x10f,(group_type_pointer)0x0,
               (value_type_pointer)0x0);
  set_arrays(in_RSI,al_00,(size_t)n_00);
  return n_00;
}

Assistant:

static table_arrays new_(allocator_type al, std::size_t n) {
        auto groups_size_index = size_index_for<group_type, size_policy>(n);
        auto groups_size = size_policy::size(groups_size_index);
        table_arrays arrays{groups_size_index, groups_size - 1, nullptr, nullptr};

        set_arrays(arrays, al, n);
        return arrays;
    }